

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.cpp
# Opt level: O1

void body(LexState *ls,expdesc *e,int ismethod,int line)

{
  byte bVar1;
  int iVar2;
  FuncState *pFVar3;
  lua_State *L;
  GCObject *o;
  Proto *pPVar4;
  int iVar5;
  Node *pNVar6;
  TString *pTVar7;
  long lVar8;
  BlockCnt bl;
  FuncState new_fs;
  BlockCnt local_88;
  FuncState local_78;
  
  pFVar3 = ls->fs;
  L = ls->L;
  o = (GCObject *)pFVar3->f;
  iVar5 = (o->p).sizep;
  lVar8 = (long)iVar5;
  if (iVar5 <= pFVar3->np) {
    pNVar6 = (Node *)luaM_growaux_(L,(o->h).node,&(o->p).sizep,8,0x3ffff,"functions");
    (o->h).node = pNVar6;
    iVar2 = (o->p).sizep;
    if (iVar5 < iVar2) {
      do {
        (&(((o->h).node)->i_val).value_)[lVar8].gc = (GCObject *)0x0;
        lVar8 = lVar8 + 1;
      } while (iVar2 != lVar8);
    }
  }
  local_78.f = luaF_newproto(L);
  pNVar6 = (o->h).node;
  iVar5 = pFVar3->np;
  pFVar3->np = iVar5 + 1;
  (&(pNVar6->i_val).value_)[iVar5].gc = (GCObject *)local_78.f;
  if (((((GCheader *)local_78.f)->marked & 3) != 0) && (((o->gch).marked & 4) != 0)) {
    luaC_barrier_(L,o,(GCObject *)local_78.f);
  }
  (local_78.f)->linedefined = line;
  open_func(ls,&local_78,&local_88);
  checknext(ls,0x28);
  if (ismethod != 0) {
    pTVar7 = luaX_newstring(ls,"self",4);
    new_localvar(ls,pTVar7);
    adjustlocalvars(ls,1);
  }
  pFVar3 = ls->fs;
  pPVar4 = pFVar3->f;
  pPVar4->is_vararg = '\0';
  iVar5 = 0;
  if ((ls->t).token != 0x29) {
    iVar5 = 0;
    while( true ) {
      iVar2 = (ls->t).token;
      if (iVar2 == 0x118) {
        luaX_next(ls);
        pPVar4->is_vararg = '\x01';
      }
      else {
        if (iVar2 != 0x120) {
          luaX_syntaxerror(ls,"<name> or \'...\' expected");
        }
        pTVar7 = str_checkname(ls);
        new_localvar(ls,pTVar7);
        iVar5 = iVar5 + 1;
      }
      if ((pPVar4->is_vararg != '\0') || ((ls->t).token != 0x2c)) break;
      luaX_next(ls);
    }
  }
  adjustlocalvars(ls,iVar5);
  bVar1 = pFVar3->nactvar;
  pPVar4->numparams = bVar1;
  luaK_reserveregs(pFVar3,(uint)bVar1);
  checknext(ls,0x29);
  statlist(ls);
  (local_78.f)->lastlinedefined = ls->linenumber;
  check_match(ls,0x106,0x109,line);
  pFVar3 = ls->fs->prev;
  iVar5 = luaK_codeABx(pFVar3,OP_CLOSURE,0,pFVar3->np - 1);
  e->t = -1;
  e->f = -1;
  e->k = VRELOCABLE;
  (e->u).info = iVar5;
  luaK_exp2nextreg(pFVar3,e);
  close_func(ls);
  return;
}

Assistant:

static void body (LexState *ls, expdesc *e, int ismethod, int line) {
  /* body ->  `(' parlist `)' block END */
  FuncState new_fs;
  BlockCnt bl;
  new_fs.f = addprototype(ls);
  new_fs.f->linedefined = line;
  open_func(ls, &new_fs, &bl);
  checknext(ls, '(');
  if (ismethod) {
    new_localvarliteral(ls, "self");  /* create 'self' parameter */
    adjustlocalvars(ls, 1);
  }
  parlist(ls);
  checknext(ls, ')');
  statlist(ls);
  new_fs.f->lastlinedefined = ls->linenumber;
  check_match(ls, TK_END, TK_FUNCTION, line);
  codeclosure(ls, e);
  close_func(ls);
}